

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin_stage.h
# Opt level: O0

int mk_plugin_stage_run_10(int socket,mk_server *server)

{
  int iVar1;
  mk_http_request *in_RDX;
  mk_http_request *extraout_RDX;
  mk_http_session *pmVar2;
  mk_list *__mptr;
  mk_plugin_stage *stage;
  mk_list *head;
  int ret;
  mk_server *server_local;
  int socket_local;
  
  stage = (mk_plugin_stage *)(server->stage10_handler).next;
  pmVar2 = (mk_http_session *)server;
  while( true ) {
    if (stage == (mk_plugin_stage *)&server->stage10_handler) {
      return -1;
    }
    iVar1 = (*stage[-1].stage30_hangup)((mk_plugin *)(ulong)(uint)socket,pmVar2,in_RDX);
    if (iVar1 == 300) break;
    stage = (mk_plugin_stage *)stage->stage20;
    in_RDX = extraout_RDX;
  }
  return 300;
}

Assistant:

static inline int mk_plugin_stage_run_10(int socket, struct mk_server *server)
{
    int ret;
    struct mk_list *head;
    struct mk_plugin_stage *stage;

    mk_list_foreach(head, &server->stage10_handler) {
        stage = mk_list_entry(head, struct mk_plugin_stage, _head);
        ret = stage->stage10(socket);
        switch (ret) {
        case MK_PLUGIN_RET_CLOSE_CONX:
            MK_TRACE("return MK_PLUGIN_RET_CLOSE_CONX");
            return MK_PLUGIN_RET_CLOSE_CONX;
        }
    }

    return -1;
}